

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ParseMagicHeader(AsciiParser *this)

{
  _Alloc_hider _Var1;
  bool bVar2;
  ssize_t sVar3;
  ostream *poVar4;
  char ver [3];
  char magic [6];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  ostringstream ss_e;
  
  bVar2 = SkipWhitespace(this);
  if (((bVar2) && (bVar2 = Eof(this), !bVar2)) &&
     (sVar3 = StreamReader::read(this->_sr,6,(void *)0x6,(size_t)magic), sVar3 != 0)) {
    if (((magic._0_4_ == 0x64737523) && (magic[4] == 'a')) && (magic[5] == ' ')) {
      bVar2 = SkipWhitespace(this);
      if (!bVar2) {
        return false;
      }
      sVar3 = StreamReader::read(this->_sr,3,(void *)0x3,(size_t)ver);
      if (sVar3 == 0) {
        return false;
      }
      if (((ver[0] == '1') && (ver[1] == '.')) && (ver[2] == '0')) {
        this->_version = 1.0;
        SkipUntilNewline(this);
        return true;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"ParseMagicHeader");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x92f);
      ::std::operator<<(poVar4," ");
      _magic = (pointer)&local_1f0;
      local_1f0._M_local_buf[0] = ver[0];
      local_1f0._M_local_buf[1] = ver[1];
      local_1f0._M_local_buf[2] = ver[2];
      local_1f0._M_local_buf[3] = '\0';
      ::std::operator+(&local_1c0,"Version must be `1.0` but got `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)magic);
      ::std::operator+(&local_1e0,&local_1c0,"`");
      poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_1e0);
      ::std::operator<<(poVar4,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"ParseMagicHeader");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x91a);
      ::std::operator<<(poVar4," ");
      _Var1._M_p = _magic;
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      local_1c0.field_2._M_local_buf[0] = magic[0];
      local_1c0.field_2._M_local_buf[1] = magic[1];
      local_1c0.field_2._M_local_buf[2] = magic[2];
      local_1c0.field_2._M_local_buf[3] = magic[3];
      magic._4_2_ = SUB82(_Var1._M_p,4);
      local_1c0.field_2._M_local_buf[4] = magic[4];
      local_1c0.field_2._M_local_buf[5] = magic[5];
      local_1c0._M_string_length = 6;
      local_1c0.field_2._M_local_buf[6] = '\0';
      _magic = _Var1._M_p;
      ::std::operator+(&local_1e0,
                       "Magic header must start with `#usda `(at least single whitespace after \'a\') but got `"
                       ,&local_1c0);
      poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_1e0);
      ::std::operator<<(poVar4,"\n");
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)&local_1e0);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
  }
  return false;
}

Assistant:

bool AsciiParser::ParseMagicHeader() {
  if (!SkipWhitespace()) {
    return false;
  }

  if (Eof()) {
    return false;
  }

  {
    char magic[6];
    if (!_sr->read(6, 6, reinterpret_cast<uint8_t *>(magic))) {
      // eol
      return false;
    }

    if ((magic[0] == '#') && (magic[1] == 'u') && (magic[2] == 's') &&
        (magic[3] == 'd') && (magic[4] == 'a') && (magic[5] == ' ')) {
      // ok
    } else {
      PUSH_ERROR_AND_RETURN(
          "Magic header must start with `#usda `(at least single whitespace "
          "after 'a') but got `" +
          std::string(magic, 6));
    }
  }

  if (!SkipWhitespace()) {
    // eof
    return false;
  }

  // current we only accept "1.0"
  {
    char ver[3];
    if (!_sr->read(3, 3, reinterpret_cast<uint8_t *>(ver))) {
      return false;
    }

    if ((ver[0] == '1') && (ver[1] == '.') && (ver[2] == '0')) {
      // ok
      _version = 1.0f;
    } else {
      PUSH_ERROR_AND_RETURN("Version must be `1.0` but got `" +
                            std::string(ver, 3) + "`");
    }
  }

  SkipUntilNewline();

  return true;
}